

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O0

string * __thiscall
MADPComponentFactoredStates::SoftPrint_abi_cxx11_(MADPComponentFactoredStates *this)

{
  ostream *this_00;
  size_t sVar1;
  void *this_01;
  MADPComponentFactoredStates *in_RSI;
  string *in_RDI;
  stringstream ss;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  MADPComponentFactoredStates *in_stack_fffffffffffffe08;
  string local_1f0 [55];
  allocator<char> local_1b9;
  string local_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [240];
  string *in_stack_ffffffffffffff68;
  MADPComponentFactoredStates *in_stack_ffffffffffffff70;
  MADPComponentFactoredStates *in_stack_ffffffffffffffe8;
  
  std::__cxx11::stringstream::stringstream(local_198);
  __s = &local_1b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdf0,(char *)__s,(allocator<char> *)in_RSI);
  AssureInitialized(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  this_00 = std::operator<<(local_188,"- nr. states=");
  sVar1 = GetNrStates(in_RSI);
  this_01 = (void *)std::ostream::operator<<(this_00,sVar1);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  SoftPrintStates_abi_cxx11_(in_stack_ffffffffffffffe8);
  std::operator<<(local_188,local_1f0);
  std::__cxx11::string::~string(local_1f0);
  std::operator<<(local_188,"Initial state distr.: ");
  SoftPrintInitialStateDistribution_abi_cxx11_(in_stack_fffffffffffffe08);
  std::operator<<(local_188,(string *)&stack0xfffffffffffffdf0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf0);
  std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string MADPComponentFactoredStates::SoftPrint() const
{
    stringstream ss;
    AssureInitialized("SoftPrint()");
    ss << "- nr. states="<< GetNrStates()<<endl;
    ss << SoftPrintStates();
    ss << "Initial state distr.: ";
    ss << SoftPrintInitialStateDistribution();
    ss << endl;
    return(ss.str());
}